

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::add_thousands_sep<char>::operator()(add_thousands_sep<char> *this,char **buffer)

{
  size_t __n;
  char *pcVar1;
  uint uVar2;
  
  uVar2 = this->digit_index_ + 1;
  this->digit_index_ = uVar2;
  if (uVar2 % 3 == 0) {
    __n = (this->sep_).size_;
    pcVar1 = *buffer;
    *buffer = pcVar1 + -__n;
    if (__n != 0) {
      memmove(pcVar1 + -__n,(this->sep_).data_,__n);
      return;
    }
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_checked(buffer, sep_.size()));
  }